

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall pstore::storage::truncate_to_physical_size(storage *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00
  ;
  element_type *this_01;
  uint64_t local_28;
  storage *this_local;
  
  peVar2 = std::
           __shared_ptr_access<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->file_);
  bVar1 = std::
          vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
          ::empty(&this->regions_);
  if (bVar1) {
    local_28 = 0;
  }
  else {
    this_00 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                 ::back(&this->regions_);
    this_01 = std::
              __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    local_28 = memory_mapper_base::end(this_01);
  }
  (*peVar2->_vptr_file_base[10])(peVar2,local_28);
  return;
}

Assistant:

void storage::truncate_to_physical_size () {
        file_->truncate (regions_.empty () ? 0 : regions_.back ()->end ());
    }